

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  uint uVar2;
  uint uVar3;
  uint _c;
  Mat *src;
  ulong _elemsize;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  size_t i;
  ulong uVar14;
  pointer pMVar15;
  void *pvVar16;
  pointer pMVar17;
  void *pvVar18;
  long lVar19;
  undefined4 *puVar20;
  int iVar21;
  int _elempack_00;
  ulong uVar22;
  ulong uVar23;
  size_t i_5;
  ulong uVar24;
  int k;
  int iVar25;
  int iVar26;
  void *pvVar27;
  ulong uVar28;
  int iVar29;
  size_t i_1;
  long lVar30;
  long lVar31;
  int *piVar32;
  bool bVar33;
  Mat local_80;
  uint local_38;
  uint local_34;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar5 = (ulong)_elempack;
  lVar12 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  iVar29 = *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar1 == 1) {
    iVar26 = src->w;
    lVar11 = 0;
    lVar30 = 0;
    uVar14 = 0;
    iVar25 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      uVar8 = *(uint *)(lVar12 + uVar14 * 4);
      uVar7 = (ulong)uVar8;
      if (uVar8 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar26 * _elempack - iVar25) / (uVar6 + lVar11);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar21 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar21),_elemsize / uVar5 << bVar4 * '\x02',iVar21,opt->blob_allocator)
      ;
      pvVar27 = *(void **)((long)&pMVar15->data + lVar30);
      if (pvVar27 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0) {
        return -100;
      }
      memcpy(pvVar27,(void *)((long)iVar25 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar15->w + lVar30) *
             *(long *)((long)&pMVar15->elemsize + lVar30));
      iVar25 = (int)uVar7 + iVar25;
      uVar14 = uVar14 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
  }
  uVar8 = (iVar29 >> 0x1f & uVar1) + iVar29;
  if ((uVar1 == 2) && (uVar8 == 0)) {
    iVar29 = src->w;
    iVar26 = src->h;
    lVar30 = 0;
    lVar11 = 0;
    uVar14 = 0;
    iVar25 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      uVar2 = *(uint *)(lVar12 + uVar14 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar26 * _elempack - iVar25) / (uVar6 + lVar30);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      iVar21 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar15->data + lVar11),iVar29,
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)iVar21),_elemsize / uVar5 << bVar4 * '\x02',iVar21,opt->blob_allocator)
      ;
      if (*(long *)((long)&pMVar15->data + lVar11) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar11) * *(long *)((long)&pMVar15->cstep + lVar11) ==
          0) {
        return -100;
      }
      iVar25 = (int)uVar7 + iVar25;
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x48;
      lVar30 = lVar30 + -1;
    }
    iVar26 = pMVar15->elempack;
    piVar32 = &pMVar15->elempack;
    while (bVar33 = uVar6 != 0, uVar6 = uVar6 - 1, bVar33) {
      if (*piVar32 < iVar26) {
        iVar26 = *piVar32;
      }
      piVar32 = piVar32 + 0x12;
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar26 < _elempack) {
      convert_packing(src,&local_80,iVar26,opt);
    }
    iVar25 = 0;
    if (0 < iVar29) {
      iVar25 = iVar29;
    }
    lVar11 = (long)(iVar29 * 4) * 4;
    uVar14 = 0;
    pvVar27 = local_80.data;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar30 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar15;
      if ((ulong)(lVar30 / 0x48) <= uVar14) break;
      pMVar17 = pMVar15 + uVar14;
      iVar21 = pMVar15[uVar14].elempack;
      if ((iVar26 == 1) && (iVar21 == 4)) {
        uVar6 = (ulong)(uint)pMVar17->h;
        if (pMVar17->h < 1) {
          uVar6 = 0;
        }
        pvVar9 = (void *)((long)(iVar29 * 3) * 4 + (long)pvVar27);
        pvVar16 = (void *)((long)(iVar29 * 2) * 4 + (long)pvVar27);
        pvVar18 = (void *)((long)iVar29 * 4 + (long)pvVar27);
        for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          puVar20 = (undefined4 *)
                    ((long)pMVar17->w * uVar7 * pMVar17->elemsize + (long)pMVar17->data);
          for (lVar30 = 0; iVar25 != (int)lVar30; lVar30 = lVar30 + 1) {
            *puVar20 = *(undefined4 *)((long)pvVar27 + lVar30 * 4);
            puVar20[1] = *(undefined4 *)((long)pvVar18 + lVar30 * 4);
            puVar20[2] = *(undefined4 *)((long)pvVar16 + lVar30 * 4);
            puVar20[3] = *(undefined4 *)((long)pvVar9 + lVar30 * 4);
            puVar20 = puVar20 + 4;
          }
          pvVar27 = (void *)((long)pvVar27 + lVar11);
          pvVar9 = (void *)((long)pvVar9 + lVar11);
          pvVar16 = (void *)((long)pvVar16 + lVar11);
          pvVar18 = (void *)((long)pvVar18 + lVar11);
        }
      }
      if (iVar26 == iVar21) {
        lVar30 = (long)pMVar17->h * (long)iVar29;
        memcpy(pMVar17->data,pvVar27,pMVar17->elemsize * lVar30);
        pvVar27 = (void *)((long)pvVar27 + (long)(int)lVar30 * (long)pMVar17->elempack * 4);
      }
      uVar14 = uVar14 + 1;
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])
                    (local_80.allocator,local_80.data,lVar30 % 0x48);
        }
      }
    }
  }
  if ((uVar1 == 2) && (uVar8 == 1)) {
    iVar29 = src->w;
    uVar2 = src->h;
    lVar11 = 0;
    lVar30 = 0;
    uVar14 = 0;
    iVar26 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = ((long)pMVar17 - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      iVar25 = *(int *)(lVar12 + uVar14 * 4);
      if (iVar25 == -0xe9) {
        iVar25 = (int)((ulong)((long)iVar29 - (long)iVar26) / (uVar6 + lVar11));
      }
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),iVar25,uVar2,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar15->data + lVar30) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0) {
        return -100;
      }
      iVar26 = iVar25 + iVar26;
      uVar14 = uVar14 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
    uVar6 = 0;
    uVar14 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = uVar6;
    }
    for (; uVar6 != uVar14; uVar6 = uVar6 + 1) {
      pvVar27 = (void *)((long)src->w * uVar6 * src->elemsize + (long)src->data);
      lVar11 = 0x2c;
      for (uVar7 = 0; uVar7 < (ulong)(((long)pMVar17 - (long)pMVar15) / 0x48); uVar7 = uVar7 + 1) {
        lVar30 = (long)*(int *)((long)&pMVar15->data + lVar11);
        memcpy((void *)(uVar6 * lVar30 * *(long *)((long)pMVar15 + lVar11 + -0x1c) +
                       *(long *)((long)pMVar15 + lVar11 + -0x2c)),pvVar27,lVar30 * _elemsize);
        pvVar27 = (void *)((long)pvVar27 + (long)*(int *)((long)&pMVar15->data + lVar11) * uVar5 * 4
                          );
        pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar11 = lVar11 + 0x48;
      }
    }
  }
  if ((uVar1 - 3 < 2) && (uVar8 == 0)) {
    iVar29 = src->w;
    iVar26 = src->h;
    iVar25 = src->d;
    iVar21 = src->c;
    lVar11 = 0;
    lVar30 = 0;
    uVar14 = 0;
    iVar13 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      uVar2 = *(uint *)(lVar12 + uVar14 * 4);
      uVar7 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar7 = (ulong)(long)(iVar21 * _elempack - iVar13) / (uVar6 + lVar11);
      }
      bVar4 = (uVar7 & 3) == 0 & opt->use_packing_layout;
      _elempack_00 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),iVar29,iVar26,iVar25,
                  (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                       (long)_elempack_00),_elemsize / uVar5 << bVar4 * '\x02',_elempack_00,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar15->data + lVar30) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0) {
        return -100;
      }
      *(uint *)((long)&pMVar15->dims + lVar30) = uVar1;
      iVar13 = (int)uVar7 + iVar13;
      uVar14 = uVar14 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
    iVar29 = pMVar15->elempack;
    piVar32 = &pMVar15->elempack;
    while (bVar33 = uVar6 != 0, uVar6 = uVar6 - 1, bVar33) {
      if (*piVar32 < iVar29) {
        iVar29 = *piVar32;
      }
      piVar32 = piVar32 + 0x12;
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar29 < _elempack) {
      convert_packing(src,&local_80,iVar29,opt);
    }
    uVar6 = 0;
    uVar14 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar15;
      if ((ulong)(lVar11 / 0x48) <= uVar14) break;
      pMVar17 = pMVar15 + uVar14;
      iVar26 = pMVar15[uVar14].elempack;
      if ((iVar29 == 1) && (iVar26 == 4)) {
        iVar26 = pMVar17->h * pMVar17->w * pMVar17->d;
        if (iVar26 < 1) {
          iVar26 = 0;
        }
        uVar6 = (ulong)(int)uVar6;
        uVar7 = (ulong)(uint)pMVar17->c;
        if (pMVar17->c < 1) {
          uVar7 = 0;
        }
        lVar30 = local_80.cstep * local_80.elemsize;
        lVar11 = lVar30 * 4;
        pvVar18 = (void *)(lVar30 * uVar6 + (long)local_80.data);
        pvVar27 = (void *)((uVar6 + 1) * lVar30 + (long)local_80.data);
        pvVar9 = (void *)((uVar6 + 2) * lVar30 + (long)local_80.data);
        pvVar16 = (void *)((uVar6 + 3) * lVar30 + (long)local_80.data);
        for (uVar22 = 0; uVar22 != uVar7; uVar22 = uVar22 + 1) {
          puVar20 = (undefined4 *)
                    (pMVar17->cstep * uVar22 * pMVar17->elemsize + (long)pMVar17->data);
          for (lVar30 = 0; iVar26 != (int)lVar30; lVar30 = lVar30 + 1) {
            *puVar20 = *(undefined4 *)((long)pvVar18 + lVar30 * 4);
            puVar20[1] = *(undefined4 *)((long)pvVar27 + lVar30 * 4);
            puVar20[2] = *(undefined4 *)((long)pvVar9 + lVar30 * 4);
            puVar20[3] = *(undefined4 *)((long)pvVar16 + lVar30 * 4);
            puVar20 = puVar20 + 4;
          }
          uVar6 = uVar6 + 4;
          pvVar18 = (void *)((long)pvVar18 + lVar11);
          pvVar27 = (void *)((long)pvVar27 + lVar11);
          pvVar9 = (void *)((long)pvVar9 + lVar11);
          pvVar16 = (void *)((long)pvVar16 + lVar11);
        }
        iVar26 = pMVar17->elempack;
      }
      if (iVar29 == iVar26) {
        memcpy(pMVar17->data,
               (void *)(local_80.cstep * (long)(int)uVar6 * local_80.elemsize + (long)local_80.data)
               ,(long)((int)pMVar17->cstep * pMVar17->c) * pMVar17->elemsize);
        uVar6 = (ulong)(uint)((int)uVar6 + pMVar17->c);
      }
      uVar14 = uVar14 + 1;
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])
                    (local_80.allocator,local_80.data,lVar11 % 0x48);
        }
      }
    }
  }
  local_34 = uVar1 ^ 4;
  local_38 = uVar8 ^ 2;
  if ((uVar8 == 1 && (uVar1 ^ 3) == 0) || (local_34 == 0 && local_38 == 0)) {
    iVar29 = src->w;
    uVar2 = src->d;
    iVar26 = src->h;
    uVar3 = src->c;
    lVar11 = 0;
    lVar30 = 0;
    iVar25 = 0;
    uVar14 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = ((long)pMVar17 - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      iVar21 = *(int *)(lVar12 + uVar14 * 4);
      if (iVar21 == -0xe9) {
        iVar21 = (int)((ulong)((long)iVar26 - (long)iVar25) / (uVar6 + lVar11));
      }
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),iVar29,iVar21,uVar2,uVar3,_elemsize,
                  _elempack,opt->blob_allocator);
      if (*(long *)((long)&pMVar15->data + lVar30) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0) {
        return -100;
      }
      *(uint *)((long)&pMVar15->dims + lVar30) = uVar1;
      iVar25 = iVar21 + iVar25;
      uVar14 = uVar14 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
    uVar6 = 0;
    uVar14 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = uVar6;
    }
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      pvVar27 = (void *)(src->cstep * uVar6 * src->elemsize + (long)src->data);
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        lVar11 = 0x40;
        for (uVar24 = 0; uVar24 < (ulong)(((long)pMVar17 - (long)pMVar15) / 0x48);
            uVar24 = uVar24 + 1) {
          lVar10 = (long)*(int *)((long)pMVar15 + lVar11 + -0x14);
          lVar19 = (long)*(int *)((long)pMVar15 + lVar11 + -0x10);
          lVar30 = *(long *)((long)pMVar15 + lVar11 + -0x30);
          lVar31 = lVar19 * lVar10;
          memcpy((void *)(lVar30 * lVar19 * uVar22 * lVar10 +
                         *(long *)((long)&pMVar15->data + lVar11) * uVar6 * lVar30 +
                         *(long *)((long)pMVar15 + lVar11 + -0x40)),pvVar27,lVar31 * _elemsize);
          pvVar27 = (void *)((long)pvVar27 + (long)((int)lVar31 * _elempack) * 4);
          pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar11 = lVar11 + 0x48;
        }
      }
    }
  }
  local_34 = local_34 | uVar8 ^ 3;
  if (((uVar1 ^ 3) == 0 && local_38 == 0) || (local_34 == 0)) {
    iVar29 = src->w;
    uVar2 = src->h;
    uVar3 = src->d;
    _c = src->c;
    lVar11 = 0;
    lVar30 = 0;
    iVar26 = 0;
    uVar14 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = ((long)pMVar17 - (long)pMVar15) / 0x48;
      if (uVar6 <= uVar14) break;
      iVar25 = *(int *)(lVar12 + uVar14 * 4);
      if (iVar25 == -0xe9) {
        iVar25 = (int)((ulong)((long)iVar29 - (long)iVar26) / (uVar6 + lVar11));
      }
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),iVar25,uVar2,uVar3,_c,_elemsize,_elempack,
                  opt->blob_allocator);
      if (*(long *)((long)&pMVar15->data + lVar30) == 0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0) {
        return -100;
      }
      *(uint *)((long)&pMVar15->dims + lVar30) = uVar1;
      iVar26 = iVar25 + iVar26;
      uVar14 = uVar14 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
    uVar6 = 0;
    uVar14 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar14 = uVar6;
    }
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar6;
    }
    uVar22 = (ulong)_c;
    if ((int)_c < 1) {
      uVar22 = uVar6;
    }
    for (; uVar6 != uVar22; uVar6 = uVar6 + 1) {
      pvVar27 = (void *)(src->cstep * uVar6 * src->elemsize + (long)src->data);
      for (uVar24 = 0; uVar24 != uVar7; uVar24 = uVar24 + 1) {
        for (uVar28 = 0; uVar28 != uVar14; uVar28 = uVar28 + 1) {
          lVar11 = 0x40;
          for (uVar23 = 0; uVar23 < (ulong)(((long)pMVar17 - (long)pMVar15) / 0x48);
              uVar23 = uVar23 + 1) {
            lVar10 = (long)*(int *)((long)pMVar15 + lVar11 + -0x14);
            lVar30 = *(long *)((long)pMVar15 + lVar11 + -0x30);
            lVar19 = lVar30 * lVar10;
            memcpy((void *)(lVar19 * uVar28 +
                            (long)*(int *)((long)pMVar15 + lVar11 + -0x10) * uVar24 * lVar19 +
                           *(long *)((long)&pMVar15->data + lVar11) * uVar6 * lVar30 +
                           *(long *)((long)pMVar15 + lVar11 + -0x40)),pvVar27,lVar10 * _elemsize);
            pvVar27 = (void *)((long)pvVar27 +
                              (long)*(int *)((long)pMVar15 + lVar11 + -0x14) * uVar5 * 4);
            pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            lVar11 = lVar11 + 0x48;
          }
        }
      }
    }
  }
  if ((uVar1 == 4) && (uVar8 == 1)) {
    iVar29 = src->w;
    iVar26 = src->h;
    iVar25 = src->d;
    uVar1 = src->c;
    lVar11 = 0;
    lVar30 = 0;
    iVar21 = 0;
    uVar5 = 0;
    while( true ) {
      pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      uVar14 = ((long)pMVar17 - (long)pMVar15) / 0x48;
      if (uVar14 <= uVar5) break;
      iVar13 = *(int *)(lVar12 + uVar5 * 4);
      if (iVar13 == -0xe9) {
        iVar13 = (int)((ulong)((long)iVar25 - (long)iVar21) / (uVar14 + lVar11));
      }
      Mat::create((Mat *)((long)&pMVar15->data + lVar30),iVar29,iVar26,iVar13,uVar1,_elemsize,
                  _elempack,opt->blob_allocator);
      if ((*(long *)((long)&pMVar15->data + lVar30) == 0) ||
         ((long)*(int *)((long)&pMVar15->c + lVar30) * *(long *)((long)&pMVar15->cstep + lVar30) ==
          0)) {
        return -100;
      }
      iVar21 = iVar13 + iVar21;
      uVar5 = uVar5 + 1;
      lVar30 = lVar30 + 0x48;
      lVar11 = lVar11 + -1;
    }
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
      pvVar27 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
      lVar12 = 0x40;
      for (uVar6 = 0; uVar6 < (ulong)(((long)pMVar17 - (long)pMVar15) / 0x48); uVar6 = uVar6 + 1) {
        lVar11 = (long)*(int *)((long)pMVar15 + lVar12 + -0xc) *
                 (long)*(int *)((long)pMVar15 + lVar12 + -0x10) *
                 (long)*(int *)((long)pMVar15 + lVar12 + -0x14);
        memcpy((void *)(*(long *)((long)&pMVar15->data + lVar12) * uVar14 *
                        *(long *)((long)pMVar15 + lVar12 + -0x30) +
                       *(long *)((long)pMVar15 + lVar12 + -0x40)),pvVar27,lVar11 * _elemsize);
        pvVar27 = (void *)((long)pvVar27 + (long)((int)lVar11 * _elempack) * 4);
        pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar17 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar12 = lVar12 + 0x48;
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    int size = top_blob.w * top_blob.h;

                    float* outptr = top_blob.channel(p).depth(j);
                    memcpy(outptr, ptr, size * elemsize);

                    ptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (int k = 0; k < h; k++)
                {
                    for (size_t i = 0; i < top_blobs.size(); i++)
                    {
                        Mat& top_blob = top_blobs[i];

                        float* outptr = top_blob.channel(p).depth(j).row(k);
                        memcpy(outptr, ptr, top_blob.w * elemsize);

                        ptr += top_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (d - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h * top_blob.d;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    return 0;
}